

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O0

void __thiscall Am_String_Data::Am_String_Data(Am_String_Data *this,char *in_value,bool copy)

{
  size_t sVar1;
  char *__dest;
  ulong uVar2;
  int size;
  char *temp;
  bool copy_local;
  char *in_value_local;
  Am_String_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00410f90;
  if (copy) {
    sVar1 = strlen(in_value);
    uVar2 = (ulong)((int)sVar1 + 1);
    if ((long)uVar2 < 0) {
      uVar2 = 0xffffffffffffffff;
    }
    __dest = (char *)operator_new__(uVar2);
    strcpy(__dest,in_value);
    this->value = __dest;
  }
  else {
    this->value = in_value;
  }
  return;
}

Assistant:

Am_String_Data::Am_String_Data(const char *in_value, bool copy)
{
  if (copy) {
    char *temp;
    int size = strlen(in_value) + 1;
    temp = new char[size];
    strcpy(temp, in_value);
    value = temp;
  } else
    value = in_value;
}